

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter_validation.h
# Opt level: O2

bool Image_Function::
     IsFullImageRow<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
               (uint32_t width,ImageTemplate<unsigned_char> *image,
               ImageTemplate<unsigned_char> *args,ImageTemplate<unsigned_char> *args_1)

{
  bool bVar1;
  ImageTemplate<unsigned_char> local_40;
  
  if (image->_rowSize == width) {
    PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_40,args_1);
    bVar1 = width == local_40._rowSize && args->_rowSize == width;
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&local_40);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool IsFullImageRow( uint32_t width, const TImage & image )
    {
        return image.rowSize() == width;
    }